

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O1

Texture * __thiscall
nesvis::PpuHelper::get_pattern_table_texture
          (Texture *__return_storage_ptr__,PpuHelper *this,uint16_t pos,uint16_t pattern_table,
          uint16_t palette)

{
  Texture *this_00;
  uint uVar1;
  IMmu *pIVar2;
  uint uVar3;
  uint uVar4;
  uint8_t col;
  uint uVar5;
  uint x;
  undefined6 in_register_00000082;
  uint8_t row;
  uint y;
  bool bVar6;
  Color color;
  Texture *texture;
  Image image;
  IntRect local_78;
  Texture *local_60;
  ulong local_58;
  Image local_50;
  
  local_60 = __return_storage_ptr__;
  sf::Image::Image(&local_50);
  sf::Color::Color((Color *)&local_78,'\n','d','\0',0xff);
  sf::Image::create(&local_50,8,8,(Color *)&local_78);
  local_58 = (ulong)((uint)pos * 0x10 + (uint)pattern_table * 0x1000);
  y = 0;
  do {
    pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
    uVar5 = y + (int)local_58;
    uVar1 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)(uVar5 & 0xffff));
    pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
    uVar5 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)(uVar5 & 0xffff | 8));
    x = 0;
    uVar4 = 7;
    do {
      pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
      uVar3 = (uint)(((uVar1 & 0xff) >> (uVar4 & 0x1f) & 1) != 0) +
              ((uVar5 & 0xff) >> ((byte)uVar4 & 0x1f) & 1) * 2 |
              (int)CONCAT62(in_register_00000082,palette) * 4 + 0x3f00U;
      uVar3 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)(ushort)uVar3,pIVar2->_vptr_IMmu,(ulong)uVar3);
      local_78.left = *(int *)((anonymous_namespace)::kPalette + (ulong)(uVar3 & 0xff) * 4);
      sf::Image::setPixel(&local_50,x,y,(Color *)&local_78);
      this_00 = local_60;
      x = x + 1;
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar6);
    y = y + 1;
  } while (y != 8);
  sf::Texture::Texture(local_60);
  local_78.left = 0;
  local_78.top = 0;
  local_78.width = 0;
  local_78.height = 0;
  sf::Texture::loadFromImage(this_00,&local_50,&local_78);
  sf::Image::~Image(&local_50);
  return this_00;
}

Assistant:

sf::Texture PpuHelper::get_pattern_table_texture(uint16_t pos,
        uint16_t pattern_table,
        uint16_t palette) {
    sf::Image image;
    image.create(8, 8, sf::Color(10, 100, 0));

    for (uint8_t row = 0; row < 8; ++row) {
        // Second pattern table starts at 0x1000
        const uint16_t base_address = pattern_table * 0x1000 + pos * 16 + row;
        const uint8_t a = nes_->ppu_mmu().read_byte(base_address);
        const uint8_t b = nes_->ppu_mmu().read_byte(base_address + 8u);

        for (uint8_t col = 0; col < 8u; ++col) {
            // First column is the leftmost bit
            const uint16_t mask = 1u << (7u - col);
            const uint8_t bit_a = !!(a & mask);
            const uint8_t bit_b = !!(b & mask);
            const uint8_t color_index =
                    bit_a | static_cast<uint8_t>(bit_b << 1u);

            const auto color = get_background_color(palette, color_index);
            image.setPixel(col, row, color);
        }
    }
    sf::Texture texture;
    texture.loadFromImage(image);
    return texture;
}